

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_paths.cpp
# Opt level: O2

void __thiscall
ExchangePaths_RoundTripForTwoPaths_Test::TestBody(ExchangePaths_RoundTripForTwoPaths_Test *this)

{
  typed_address<pstore::indirect_string> tVar1;
  undefined1 auVar2 [16];
  uint generation;
  string *psVar3;
  parser<pstore::exchange::import_ns::callbacks> *this_00;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uVar4;
  typed_address<pstore::indirect_string> *ptVar5;
  database *pdVar6;
  char **this_01;
  string_mapping *string_table;
  char *pcVar7;
  error_code eVar8;
  insert_iterator<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>_>
  out_00;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_270;
  shared_sstring_view owner;
  array<const_char_*,_2UL> paths;
  char *local_238 [3];
  mock_mutex mutex;
  AssertionResult gtest_ar_;
  AssertHelper local_208;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>_>
  indir_strings;
  int local_1a8;
  error_category *local_1a0;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  out;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_120;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_118;
  coord local_110;
  string_mapping imported_names;
  ostringstream exported_names_stream;
  
  pstore::exchange::export_ns::ostringstream::ostringstream(&exported_names_stream);
  paths._M_elems[0] = "path1";
  paths._M_elems[1] = "path2";
  indir_strings._M_h._M_buckets = &indir_strings._M_h._M_single_bucket;
  indir_strings._M_h._M_bucket_count = 1;
  indir_strings._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  indir_strings._M_h._M_element_count = 0;
  indir_strings._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  indir_strings._M_h._M_rehash_policy._M_next_resize = 0;
  indir_strings._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pdVar6 = &(this->super_ExchangePaths).export_db_;
  out_00.iter.
  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
  ._M_cur = (_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_true>
             )0x0;
  out_00.container = &indir_strings;
  add_export_strings<(pstore::trailer::indices)4,char_const**,std::insert_iterator<std::unordered_map<std::__cxx11::string,pstore::typed_address<pstore::indirect_string>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,pstore::typed_address<pstore::indirect_string>>>>>>
            (pdVar6,paths._M_elems,local_238,out_00);
  pstore::exchange::export_ns::string_mapping::string_mapping<(pstore::trailer::indices)4>
            ((string_mapping *)&imported_names,pdVar6);
  generation = pstore::database::get_current_revision(pdVar6);
  pcVar7 = "";
  std::__cxx11::string::string((string *)&out,"",(allocator *)&owner);
  string_table = &imported_names;
  pstore::exchange::export_ns::emit_strings<(pstore::trailer::indices)4>
            (&exported_names_stream.super_ostream_base,(indent)0x0,pdVar6,generation,(string *)&out,
             (string_mapping *)string_table,false);
  std::__cxx11::string::~string((string *)&out);
  std::
  _Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<pstore::address,_std::pair<const_pstore::address,_unsigned_long>,_std::allocator<std::pair<const_pstore::address,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<pstore::address>,_std::hash<pstore::address>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&imported_names);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::typed_address<pstore::indirect_string>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&indir_strings._M_h);
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  imported_names.adder_.views_.
  super__Vector_base<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>,_std::allocator<std::pair<const_pstore::sstring_view<const_char_*>_*,_pstore::typed_address<pstore::address>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.strings_;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&imported_names.views_;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node._M_size = 0;
  imported_names.lookup_._M_h._M_buckets = &imported_names.lookup_._M_h._M_single_bucket;
  imported_names.lookup_._M_h._M_bucket_count = 1;
  imported_names.lookup_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  imported_names.lookup_._M_h._M_element_count = 0;
  imported_names.lookup_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  imported_names.lookup_._M_h._M_rehash_policy._M_next_resize = 0;
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  imported_names.strings_.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.strings_.
       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  imported_names.views_.
  super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       imported_names.views_.
       super__List_base<pstore::sstring_view<const_char_*>,_std::allocator<pstore::sstring_view<const_char_*>_>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  std::unique_lock<mock_mutex>::unique_lock((unique_lock<mock_mutex> *)&indir_strings,&mutex);
  pdVar6 = &(this->super_ExchangePaths).import_db_;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&out,pdVar6,(lock_type *)&indir_strings);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&indir_strings);
  anon_unknown.dwarf_3015a9::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&indir_strings,(transaction *)&out,
             &imported_names);
  psVar3 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_names_stream);
  this_00 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                      ((parser<pstore::exchange::import_ns::callbacks> *)&indir_strings,psVar3);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(this_00);
  gtest_ar_._1_7_ = gtest_ar_._1_7_;
  gtest_ar_.success_ = local_1a8 == 0;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )0x0;
  if (local_1a8 != 0) {
    testing::Message::Message((Message *)&local_270);
    std::operator<<((ostream *)(local_270._M_head_impl + 0x10),"JSON error was: ");
    (**(code **)(*(long *)local_1a0 + 0x20))(&paths,local_1a0,local_1a8);
    std::operator<<((ostream *)(local_270._M_head_impl + 0x10),(string *)&paths);
    std::operator<<((ostream *)(local_270._M_head_impl + 0x10),' ');
    pstore::json::operator<<((ostream *)(local_270._M_head_impl + 0x10),&local_110);
    std::operator<<((ostream *)(local_270._M_head_impl + 0x10),'\n');
    psVar3 = pstore::exchange::export_ns::ostringstream::str_abi_cxx11_(&exported_names_stream);
    std::operator<<((ostream *)(local_270._M_head_impl + 0x10),(string *)psVar3);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&owner,(internal *)&gtest_ar_,(AssertionResult *)"name_parser.has_error ()"
               ,"true","false",(char *)string_table);
    testing::internal::AssertHelper::AssertHelper
              (&local_208,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
               ,0x96,owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    testing::internal::AssertHelper::operator=(&local_208,(Message *)&local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_208);
    std::__cxx11::string::~string((string *)&owner);
    std::__cxx11::string::~string((string *)&paths);
    if (local_270._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_270._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
              ((parser<pstore::exchange::import_ns::callbacks> *)&indir_strings);
    pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
              ((transaction<std::unique_lock<mock_mutex>_> *)&out);
    goto LAB_00167f28;
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&indir_strings);
  pstore::transaction_base::commit((transaction_base *)&out);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)&out);
  out.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  out.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&out;
  out.
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&out;
  paths._M_elems[0] = (char *)pstore::exchange::import_ns::string_mapping::size(&imported_names);
  owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       CONCAT44(owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_,2
               );
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&indir_strings,"imported_names.size ()","2U",(unsigned_long *)&paths,
             (uint *)&owner);
  if ((char)indir_strings._M_h._M_buckets == '\0') {
    testing::Message::Message((Message *)&paths);
    if (indir_strings._M_h._M_bucket_count != 0) {
      pcVar7 = *(char **)indir_strings._M_h._M_bucket_count;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&owner,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
               ,0xa0,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&owner,(Message *)&paths);
    this_01 = (char **)&indir_strings._M_h._M_bucket_count;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&owner);
    if (paths._M_elems[0] != (char *)0x0) {
      (**(code **)(*(long *)paths._M_elems[0] + 8))();
    }
LAB_00167e45:
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)this_01);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&indir_strings._M_h._M_bucket_count);
    pstore::exchange::import_ns::string_mapping::lookup
              ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&paths,&imported_names,0
              );
    eVar8 = pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::get_error
                      ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&paths);
    owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)eVar8._M_cat;
    owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         CONCAT44(owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
                  ,eVar8._M_value);
    auVar2._12_4_ = 0;
    auVar2._0_12_ = (undefined1  [12])gtest_ar_._4_12_;
    gtest_ar_ = (AssertionResult)(auVar2 << 0x20);
    uVar4._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::_V2::system_category();
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         uVar4._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    testing::internal::CmpHelperEQ<std::error_code,std::error_code>
              ((internal *)&indir_strings,"str_addr_or_err.get_error ()","std::error_code{}",
               (error_code *)&owner,(error_code *)&gtest_ar_);
    if ((char)indir_strings._M_h._M_buckets == '\0') {
      testing::Message::Message((Message *)&owner);
      if (indir_strings._M_h._M_bucket_count == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)indir_strings._M_h._M_bucket_count;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                 ,0xa4,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&owner);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&indir_strings._M_h._M_bucket_count);
      owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      owner.size_ = 0;
      ptVar5 = pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
               value_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>const&,pstore::typed_address<pstore::indirect_string>const>
                         ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&paths);
      tVar1.a_.a_ = (address)(ptVar5->a_).a_;
      local_118.ptr_ = &owner;
      pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::ensure_invariant
                (&local_118);
      gtest_ar_ = (AssertionResult)pstore::get_sstring_view(pdVar6,tVar1,local_118);
      pstore::sstring_view<char_const*>::to_string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&indir_strings
                 ,(sstring_view<char_const*> *)&gtest_ar_,(allocator<char> *)&local_270);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&out,(value_type *)&indir_strings);
      std::__cxx11::string::~string((string *)&indir_strings);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
      ;
      pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::~error_or
                ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&paths);
      pstore::exchange::import_ns::string_mapping::lookup
                ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&paths,&imported_names
                 ,1);
      eVar8 = pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::get_error
                        ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&paths);
      owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)eVar8._M_cat;
      owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           CONCAT44(owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                    _4_4_,eVar8._M_value);
      gtest_ar_._0_8_ = gtest_ar_._4_8_ << 0x20;
      testing::internal::CmpHelperEQ<std::error_code,std::error_code>
                ((internal *)&indir_strings,"str_addr_or_err.get_error ()","std::error_code{}",
                 (error_code *)&owner,(error_code *)&gtest_ar_);
      if ((char)indir_strings._M_h._M_buckets != '\0') {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&indir_strings._M_h._M_bucket_count);
        owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        owner.size_ = 0;
        ptVar5 = pstore::error_or<pstore::typed_address<pstore::indirect_string>>::
                 value_storage_impl<pstore::error_or<pstore::typed_address<pstore::indirect_string>>const&,pstore::typed_address<pstore::indirect_string>const>
                           ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&paths);
        tVar1.a_.a_ = (address)(ptVar5->a_).a_;
        local_120.ptr_ = &owner;
        pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::
        ensure_invariant(&local_120);
        gtest_ar_ = (AssertionResult)pstore::get_sstring_view(pdVar6,tVar1,local_120);
        pstore::sstring_view<char_const*>::to_string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &indir_strings,(sstring_view<char_const*> *)&gtest_ar_,
                   (allocator<char> *)&local_270);
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&out,(value_type *)&indir_strings);
        std::__cxx11::string::~string((string *)&indir_strings);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::~error_or
                  ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&paths);
        paths._M_elems[0] = "path2";
        paths._M_elems[1] = "path1";
        testing::internal::
        PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreMatcher<std::tuple<char_const*,char_const*>>>
        ::operator()(&indir_strings,(char *)&paths,
                     (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)0x1cb283);
        if ((char)indir_strings._M_h._M_buckets == '\0') {
          testing::Message::Message((Message *)&paths);
          if (indir_strings._M_h._M_bucket_count == 0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)indir_strings._M_h._M_bucket_count;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&owner,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                     ,0xaf,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&owner,(Message *)&paths);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&owner);
          if (paths._M_elems[0] != (char *)0x0) {
            (**(code **)(*(long *)paths._M_elems[0] + 8))();
          }
        }
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&indir_strings._M_h._M_bucket_count);
        pstore::exchange::import_ns::string_mapping::lookup
                  ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&indir_strings,
                   &imported_names,2);
        owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             CONCAT44(owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
                      _4_4_,4);
        testing::internal::
        CmpHelperEQ<pstore::error_or<pstore::typed_address<pstore::indirect_string>>,pstore::exchange::import_ns::error>
                  ((internal *)&paths,"imported_names.lookup (2U)",
                   "pstore::exchange::import_ns::error::no_such_name",
                   (error_or<pstore::typed_address<pstore::indirect_string>_> *)&indir_strings,
                   (error *)&owner);
        pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::~error_or
                  ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&indir_strings);
        if ((char)paths._M_elems[0] == '\0') {
          testing::Message::Message((Message *)&indir_strings);
          if (paths._M_elems[1] == (char *)0x0) {
            pcVar7 = "";
          }
          else {
            pcVar7 = *(char **)paths._M_elems[1];
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&owner,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                     ,0xb0,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&owner,(Message *)&indir_strings);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&owner);
          if (indir_strings._M_h._M_buckets != (__buckets_ptr)0x0) {
            (*(code *)(*indir_strings._M_h._M_buckets)[1]._M_nxt)();
          }
        }
        this_01 = paths._M_elems + 1;
        goto LAB_00167e45;
      }
      testing::Message::Message((Message *)&owner);
      if (indir_strings._M_h._M_bucket_count == 0) {
        pcVar7 = "";
      }
      else {
        pcVar7 = *(char **)indir_strings._M_h._M_bucket_count;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_paths.cpp"
                 ,0xaa,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_,(Message *)&owner);
    }
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_);
    if (owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      (**(code **)(*(long *)owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&indir_strings._M_h._M_bucket_count);
    pstore::error_or<pstore::typed_address<pstore::indirect_string>_>::~error_or
              ((error_or<pstore::typed_address<pstore::indirect_string>_> *)&paths);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear(&out.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            );
LAB_00167f28:
  pstore::exchange::import_ns::string_mapping::~string_mapping(&imported_names);
  pstore::exchange::export_ns::ostringstream::~ostringstream(&exported_names_stream);
  return;
}

Assistant:

TEST_F (ExchangePaths, RoundTripForTwoPaths) {
    // The output from the export phase.
    static constexpr auto comments = false;
    pstore::exchange::export_ns::ostringstream exported_names_stream;

    // The export phase. We put two strings into the paths index and export it.
    {
        std::array<pstore::gsl::czstring, 2> paths{{"path1", "path2"}};
        std::unordered_map<std::string, pstore::typed_address<pstore::indirect_string>>
            indir_strings;
        add_export_strings<pstore::trailer::indices::path> (
            export_db_, std::begin (paths), std::end (paths),
            std::inserter (indir_strings, std::end (indir_strings)));

        // Write the paths that we just created as JSON.
        pstore::exchange::export_ns::string_mapping exported_names{
            export_db_, pstore::exchange::export_ns::path_index_tag ()};
        pstore::exchange::export_ns::emit_strings<pstore::trailer::indices::path> (
            exported_names_stream, pstore::exchange::export_ns::indent{}, export_db_,
            export_db_.get_current_revision (), "", &exported_names, comments);
    }

    // The output from the import phase: the mapping from path index to address.
    pstore::exchange::import_ns::string_mapping imported_names;

    // The import phase. Read the JSON produced by the export phase and populate a database
    // accordingly.
    {
        mock_mutex mutex;
        auto transaction = begin (import_db_, transaction_lock{mutex});
        {
            auto name_parser = import_strings_parser (&transaction, &imported_names);
            name_parser.input (exported_names_stream.str ()).eof ();
            ASSERT_FALSE (name_parser.has_error ())
                << "JSON error was: " << name_parser.last_error ().message () << ' '
                << name_parser.coordinate () << '\n'
                << exported_names_stream.str ();
        }
        transaction.commit ();
    }

    // Now verify the result of the import phase.
    std::list<std::string> out;
    ASSERT_EQ (imported_names.size (), 2U);

    {
        auto const str_addr_or_err = imported_names.lookup (0U);
        ASSERT_EQ (str_addr_or_err.get_error (), std::error_code{});
        pstore::shared_sstring_view owner;
        out.push_back (get_sstring_view (import_db_, *str_addr_or_err, &owner).to_string ());
    }
    {
        auto const str_addr_or_err = imported_names.lookup (1U);
        ASSERT_EQ (str_addr_or_err.get_error (), std::error_code{});
        pstore::shared_sstring_view owner;
        out.push_back (get_sstring_view (import_db_, *str_addr_or_err, &owner).to_string ());
    }

    EXPECT_THAT (out, testing::UnorderedElementsAre ("path1", "path2"));
    EXPECT_EQ (imported_names.lookup (2U), pstore::exchange::import_ns::error::no_such_name);
}